

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O2

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Ray *_ray,Triangle *_triangle)

{
  bool bVar1;
  vec3 vVar2;
  float t;
  float v;
  float u;
  float local_1c;
  float local_18;
  float local_14;
  
  __return_storage_ptr__->distance = 0.0;
  bVar1 = intersection(_ray,_triangle,&local_1c,&local_14,&local_18);
  __return_storage_ptr__->hit = bVar1;
  if (bVar1) {
    __return_storage_ptr__->distance = local_1c;
    vVar2 = Ray::getAt(_ray,local_1c);
    __return_storage_ptr__->position = vVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Ray& _ray, const Triangle& _triangle) {

    IntersectionData idata;

    float t,u,v;
    idata.hit = intersection(_ray, _triangle, t, u, v);
    // idata.hit = intersectionMT(_ray, _triangle, t, u, v);

    if (!idata.hit) return idata;

    // float vn = glm::dot(_ray.getDirection(), _triangle.getNormal());
    // glm::vec3 aa = _ray.getOrigin() - _triangle[0];
    // float xpn = glm::dot(aa, _triangle.getNormal());
    // idata.distance = -xpn / vn;
    idata.distance = t;
    idata.position = _ray.getAt(t);
    return idata;

}